

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O0

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::set_color
          (ansicolor_sink<spdlog::details::console_mutex> *this,level_enum color_level,
          string_view_t color)

{
  reference this_00;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
  *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff98;
  string local_48 [32];
  string_view_t *in_stack_ffffffffffffffd8;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffff98);
  to_string__abi_cxx11_(in_stack_ffffffffffffffd8);
  this_00 = std::
            array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
            ::at(in_RDI,(size_type)in_stack_ffffffffffffff98);
  std::__cxx11::string::operator=((string *)this_00,local_48);
  std::__cxx11::string::~string(local_48);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x372bf1);
  return;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_color(level::level_enum color_level,
                                                           string_view_t color) {
    std::lock_guard<mutex_t> lock(mutex_);
    colors_.at(static_cast<size_t>(color_level)) = to_string_(color);
}